

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::pred_per_update_feature<false,false,1ul,2ul,3ul,true>(norm_data *nd,float x,float *fw)

{
  uint uVar1;
  vw_exception *this;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  fVar3 = *fw;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar4 = x * x;
    fVar5 = 1.175494e-38;
    if (1.175494e-38 <= fVar4) {
      fVar5 = fVar4;
    }
    if (3.4028235e+38 < fVar5) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_190,"your features have too much magnitude");
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                 ,500,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    uVar1 = *(uint *)(&DAT_00233560 + (ulong)(0.0 < x) * 4);
    nd->extra_state[0] = fVar3;
    fVar2 = fw[1];
    nd->extra_state[1] = fVar2;
    fVar3 = fw[2];
    nd->extra_state[2] = fVar3;
    fVar2 = nd->grad_squared * fVar5 + fVar2;
    nd->extra_state[1] = fVar2;
    fVar4 = ABS((float)(uVar1 & -(uint)(fVar4 < 1.175494e-38) |
                       ~-(uint)(fVar4 < 1.175494e-38) & (uint)x));
    if (fVar3 < fVar4) {
      if (0.0 < fVar3) {
        fVar3 = powf((fVar4 / fVar3) * (fVar4 / fVar3),(nd->pd).neg_norm_power);
        nd->extra_state[0] = fVar3 * nd->extra_state[0];
        fVar2 = nd->extra_state[1];
      }
      nd->extra_state[2] = fVar4;
      fVar3 = fVar4;
    }
    nd->norm_x = fVar5 / (fVar3 * fVar3) + nd->norm_x;
    fVar3 = powf(fVar2,(nd->pd).minus_power_t);
    fVar4 = powf(nd->extra_state[2] * nd->extra_state[2],(nd->pd).neg_norm_power);
    nd->extra_state[3] = fVar4 * fVar3;
    nd->pred_per_update = fVar4 * fVar3 * fVar5 + nd->pred_per_update;
  }
  return;
}

Assistant:

inline void pred_per_update_feature(norm_data& nd, float x, float& fw)
{
  if (feature_mask_off || fw != 0.)
  {
    weight* w = &fw;
    float x2 = x * x;
    if (x2 < x2_min)
    {
      x = (x > 0) ? x_min : -x_min;
      x2 = x2_min;
    }
    if (x2 > x2_max)
      THROW("your features have too much magnitude");
    if (stateless)  // we must not modify the parameter state so introduce a shadow version.
    {
      nd.extra_state[0] = w[0];
      nd.extra_state[adaptive] = w[adaptive];
      nd.extra_state[normalized] = w[normalized];
      w = nd.extra_state;
    }
    if (adaptive)
      w[adaptive] += nd.grad_squared * x2;
    if (normalized)
    {
      float x_abs = fabsf(x);
      if (x_abs > w[normalized])  // new scale discovered
      {
        if (w[normalized] >
            0.)  // If the normalizer is > 0 then rescale the weight so it's as if the new scale was the old scale.
        {
          if (sqrt_rate)
          {
            float rescale = w[normalized] / x_abs;
            w[0] *= (adaptive ? rescale : rescale * rescale);
          }
          else
          {
            float rescale = x_abs / w[normalized];
            w[0] *= powf(rescale * rescale, nd.pd.neg_norm_power);
          }
        }
        w[normalized] = x_abs;
      }
      nd.norm_x += x2 / (w[normalized] * w[normalized]);
    }
    w[spare] = compute_rate_decay<sqrt_rate, adaptive, normalized>(nd.pd, w[0]);
    nd.pred_per_update += x2 * w[spare];
  }
}